

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_dup(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t options,ly_bool nosiblings,
              lyd_node **dup_p)

{
  lysc_node *schema2;
  lysc_node *plVar1;
  bool bVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lyd_node *siblings;
  uint uVar6;
  lys_module *plVar7;
  lysc_node **pplVar8;
  lysc_node **pplVar9;
  lys_module *plVar10;
  undefined7 in_register_00000081;
  lyd_node *plVar11;
  lyd_node *plVar12;
  uint uVar13;
  byte bVar14;
  lys_module *local_80;
  lyd_node *dup;
  lys_module *local_68;
  ly_ctx *local_60;
  lys_module *local_58;
  uint local_50;
  undefined4 local_4c;
  lyd_node *local_48;
  lyd_node *first_sibling;
  lyd_node **local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000081,nosiblings);
  dup = (lyd_node *)0x0;
  first_sibling = (lyd_node *)0x0;
  local_60 = trg_ctx;
  if (trg_ctx == (ly_ctx *)0x0) {
    __assert_fail("node && trg_ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x8e1,
                  "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                 );
  }
  local_38 = dup_p;
  if ((options & 4) == 0) {
    local_80 = (lys_module *)0x0;
    plVar10 = (lys_module *)parent;
  }
  else {
    local_50 = options & 10;
    local_68 = (lys_module *)0x0;
    local_58 = (lys_module *)&parent[2].schema;
    bVar2 = true;
    local_80 = (lys_module *)0x0;
    plVar10 = (lys_module *)0x0;
    local_48 = node;
    bVar14 = (byte)node->flags >> 3 & 1;
    while ((bVar2 && (node = (lyd_node *)(((lyd_node_inner *)node)->field_0).node.parent,
                     node != (lyd_node *)0x0))) {
      if (bVar14 != 0) {
        plVar1 = (((lyd_node_inner *)node)->field_0).node.schema;
        if (plVar1 == (lysc_node *)0x0) {
          plVar5 = (lys_module *)((long)&((lyd_node_inner *)((long)node + 0x48))->field_0 + 0x30);
        }
        else {
          plVar5 = plVar1->module;
        }
        trg_ctx = plVar5->ctx;
      }
      if (parent == (lyd_node *)0x0) {
LAB_00120f7e:
        local_68 = (lys_module *)0x0;
        LVar4 = lyd_dup_r(node,trg_ctx,(lyd_node *)0x0,0,(lyd_node **)&local_68,local_50,
                          (lyd_node **)&local_68);
        if (LVar4 != LY_SUCCESS) goto LAB_0012105d;
        if (local_80 != (lys_module *)0x0) {
          lyd_insert_node((lyd_node *)local_68,(lyd_node **)0x0,(lyd_node *)local_80,0);
        }
        local_80 = local_68;
      }
      else {
        plVar1 = parent->schema;
        plVar5 = local_58;
        if (plVar1 != (lysc_node *)0x0) {
          plVar5 = plVar1->module;
        }
        schema2 = (((lyd_node_inner *)node)->field_0).node.schema;
        if (schema2 == (lysc_node *)0x0) {
          plVar7 = (lys_module *)((long)&((lyd_node_inner *)((long)node + 0x48))->field_0 + 0x30);
        }
        else {
          plVar7 = schema2->module;
        }
        if ((plVar1 != schema2) || (plVar5->ctx != plVar7->ctx)) {
          plVar5 = local_58;
          if (plVar1 != (lysc_node *)0x0) {
            plVar5 = plVar1->module;
          }
          if (schema2 == (lysc_node *)0x0) {
            plVar7 = (lys_module *)((long)&((lyd_node_inner *)((long)node + 0x48))->field_0 + 0x30);
          }
          else {
            plVar7 = schema2->module;
          }
          if (((plVar5->ctx == plVar7->ctx) ||
              (lVar3 = lyd_compare_schema_equal(plVar1,schema2), lVar3 == '\0')) ||
             (lVar3 = lyd_compare_schema_parents_equal(parent,node), lVar3 == '\0'))
          goto LAB_00120f7e;
        }
        bVar2 = false;
        local_68 = (lys_module *)parent;
      }
      if (plVar10 == (lys_module *)0x0) {
        plVar10 = local_68;
      }
      if ((undefined1  [56])
          ((undefined1  [56])((lyd_node_inner *)node)->field_0 & (undefined1  [56])0x800000000) !=
          (undefined1  [56])0x0) {
        bVar14 = 1;
      }
    }
    if (parent != (lyd_node *)0x0 && bVar2) {
      pplVar8 = &local_48[1].schema;
      if (local_48->schema != (lysc_node *)0x0) {
        pplVar8 = (lysc_node **)&local_48->schema->name;
      }
      pplVar9 = &parent[1].schema;
      if (parent->schema != (lysc_node *)0x0) {
        pplVar9 = (lysc_node **)&parent->schema->name;
      }
      LVar4 = LY_EINVAL;
      ly_log(trg_ctx,LY_LLERR,LY_EINVAL,
             "None of the duplicated node \"%s\" schema parents match the provided parent \"%s\".",
             *pplVar8,*pplVar9);
LAB_0012105d:
      plVar12 = dup;
      if (local_80 != (lys_module *)0x0) {
LAB_001211e2:
        lyd_free_tree((lyd_node *)local_80);
        return LVar4;
      }
LAB_00121206:
      lyd_free_siblings(plVar12);
      return LVar4;
    }
    node = local_48;
    if (local_80 != (lys_module *)0x0 && parent != (lyd_node *)0x0) {
      lyd_insert_node(parent,(lyd_node **)0x0,(lyd_node *)local_80,0);
      node = local_48;
    }
  }
  uVar13 = options >> 5 & 2;
  plVar11 = (lyd_node *)0x0;
  plVar12 = (lyd_node *)0x0;
  local_58 = plVar10;
  for (; node != (lyd_node *)0x0; node = node->next) {
    plVar1 = node->schema;
    uVar6 = uVar13;
    if (plVar1 == (lysc_node *)0x0) {
      if (plVar12 == (lyd_node *)0x0) {
        plVar12 = (lyd_node *)0x0;
      }
      else {
LAB_001210f9:
        if (plVar1 == plVar12->schema) {
          uVar6 = 1;
        }
        else {
          plVar12 = (lyd_node *)0x0;
        }
      }
LAB_00121144:
      LVar4 = lyd_dup_r(node,local_60,(lyd_node *)local_58,uVar6,&first_sibling,options,&dup);
      if (LVar4 != LY_SUCCESS) {
LAB_001211d8:
        if (local_80 != (lys_module *)0x0) goto LAB_001211e2;
        plVar12 = dup;
        if (plVar11 != (lyd_node *)0x0) {
          plVar12 = plVar11;
        }
        goto LAB_00121206;
      }
      if (plVar12 == (lyd_node *)0x0) {
        plVar12 = (lyd_node *)0x0;
      }
      else if (dup->next != (lyd_node *)0x0) {
        plVar12 = (lyd_node *)0x0;
      }
    }
    else {
      if ((plVar1->nodetype != 4) || ((plVar1->flags & 0x100) == 0)) {
        if (plVar12 != (lyd_node *)0x0) goto LAB_001210f9;
        plVar12 = node;
        if ((plVar1->nodetype & 0x18) == 0) {
          plVar12 = (lyd_node *)0x0;
        }
        goto LAB_00121144;
      }
      if (local_58 == (lys_module *)0x0) {
        if ((options & 4) != 0) {
          __assert_fail("!(options & LYD_DUP_WITH_PARENTS)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                        ,0x8f1,
                        "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                       );
        }
        LVar4 = lyd_dup_r(node,local_60,(lyd_node *)0x0,0,&first_sibling,options,&dup);
        if (LVar4 == LY_SUCCESS) goto LAB_00121185;
        goto LAB_001211d8;
      }
      siblings = lyd_child((lyd_node *)local_58);
      LVar4 = lyd_find_sibling_schema(siblings,plVar1,&dup);
      if (LVar4 != LY_SUCCESS) {
        ly_log(local_60,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c",
               0x8ef);
        goto LAB_001211d8;
      }
    }
LAB_00121185:
    if (plVar11 == (lyd_node *)0x0) {
      plVar11 = dup;
    }
    if ((char)local_4c != '\0') break;
  }
  if (local_38 != (lyd_node **)0x0) {
    *local_38 = plVar11;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_dup(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t options,
        ly_bool nosiblings, struct lyd_node **dup_p)
{
    LY_ERR rc;
    const struct lyd_node *orig;            /* original node to be duplicated */
    struct lyd_node *first_dup = NULL;      /* the first duplicated node, this is returned */
    struct lyd_node *top = NULL;            /* the most higher created node */
    struct lyd_node *local_parent = NULL;   /* the direct parent node for the duplicated node(s) */
    struct lyd_node *dup = NULL;            /* duplicate node */
    struct lyd_node *first_sibling = NULL;  /* first sibling node */
    const struct lyd_node *first_llist = NULL;  /* first duplicated (leaf-)list node, if any */
    uint32_t insert_order;

    assert(node && trg_ctx);

    if (options & LYD_DUP_WITH_PARENTS) {
        LY_CHECK_GOTO(rc = lyd_dup_get_local_parent(node, trg_ctx, parent, options & (LYD_DUP_WITH_FLAGS | LYD_DUP_NO_META),
                &top, &local_parent), error);
    } else {
        local_parent = parent;
    }

    LY_LIST_FOR(node, orig) {
        if (lysc_is_key(orig->schema)) {
            if (local_parent) {
                /* the key must already exist in the parent */
                rc = lyd_find_sibling_schema(lyd_child(local_parent), orig->schema, &dup);
                LY_CHECK_ERR_GOTO(rc, LOGINT(trg_ctx), error);
            } else {
                assert(!(options & LYD_DUP_WITH_PARENTS));
                /* duplicating a single key, okay, I suppose... */
                rc = lyd_dup_r(orig, trg_ctx, NULL, LYD_INSERT_NODE_DEFAULT, &first_sibling, options, &dup);
                LY_CHECK_GOTO(rc, error);
            }
        } else {
            /* decide insert order */
            insert_order = (options & LYD_DUP_NO_LYDS) ? LYD_INSERT_NODE_LAST_BY_SCHEMA : LYD_INSERT_NODE_DEFAULT;
            if (first_llist) {
                if (orig->schema != first_llist->schema) {
                    /* all the (leaf-)list instances duplicated */
                    first_llist = NULL;
                } else {
                    /* duplicating all the instances of a (leaf-)list, no need to change their order */
                    insert_order = LYD_INSERT_NODE_LAST;
                }
            } else if (orig->schema && (orig->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
                /* duplicating the first (leaf-)list instance, duplicate the rest more efficiently */
                first_llist = orig;
            }

            /* duplicate the node */
            rc = lyd_dup_r(orig, trg_ctx, local_parent, insert_order, &first_sibling, options, &dup);
            LY_CHECK_GOTO(rc, error);

            if (first_llist && dup->next) {
                /* orig was not the last node (because we are inserting into a parent with some previous instances),
                 * we must check find the order */
                first_llist = NULL;
            }
        }
        first_dup = first_dup ? first_dup : dup;

        if (nosiblings) {
            break;
        }
    }

    if (dup_p) {
        *dup_p = first_dup;
    }
    return LY_SUCCESS;

error:
    if (top) {
        lyd_free_tree(top);
    } else if (first_dup) {
        lyd_free_siblings(first_dup);
    } else {
        lyd_free_siblings(dup);
    }
    return rc;
}